

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsLib.cpp
# Opt level: O1

long bhf::ads::AddRemoteRoute
               (string *remote,AmsNetId destNetId,string *destAddr,string *routeName,
               string *remoteUsername,string *remotePassword)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  unsigned_short uVar5;
  unsigned_short uVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  ostream *poVar10;
  uint32_t serviceId;
  int iVar11;
  Frame f;
  AmsAddr myAddr;
  stringstream stream;
  undefined4 local_210;
  undefined2 local_20c;
  string local_208;
  Frame local_1e8;
  ios_base *local_1c8;
  undefined4 local_1c0;
  undefined2 local_1bc;
  undefined2 local_1ba;
  int local_1b8 [4];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_210 = destNetId.b._0_4_;
  local_20c = destNetId.b._4_2_;
  Frame::Frame(&local_1e8,0x100,(void *)0x0);
  bVar1 = PrependUdpTag(&local_1e8,destAddr,5);
  bVar2 = PrependUdpTag(&local_1e8,remotePassword,2);
  bVar3 = PrependUdpTag(&local_1e8,remoteUsername,0xd);
  Frame::prepend(&local_1e8,&local_210,6);
  local_1b8[0]._0_2_ = 6;
  Frame::prepend(&local_1e8,local_1b8,2);
  local_1b8[0] = CONCAT22(local_1b8[0]._2_2_,7);
  Frame::prepend(&local_1e8,local_1b8,2);
  if (routeName->_M_string_length != 0) {
    destAddr = routeName;
  }
  bVar4 = PrependUdpTag(&local_1e8,destAddr,0xc);
  serviceId = (uint32_t)bVar2;
  local_1b8[0] = (uint)bVar4 + (uint)bVar1 + (uint)bVar2 + (uint)bVar3 + 1;
  Frame::prepend(&local_1e8,(stringstream *)local_1b8,4);
  local_1bc = local_20c;
  local_1c0 = local_210;
  local_1ba = 0;
  Frame::prepend(&local_1e8,&local_1c0,8);
  uVar8 = SendRecv((ads *)remote,(string *)&local_1e8,(Frame *)0x6,serviceId);
  if (uVar8 == 0) {
    sVar9 = Frame::capacity(&local_1e8);
    if (sVar9 < 0xc) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"AddRemoteRoute",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"(): frame too short to be AMS response \'0x",0x2a);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      Frame::capacity(&local_1e8);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'\n",2);
      std::__cxx11::stringbuf::str();
      Logger::Log(3,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0x705;
    }
    else {
      Frame::remove(&local_1e8,(char *)0x8);
      uVar7 = Frame::pop<unsigned_int>(&local_1e8);
      local_1c8 = local_138;
      iVar11 = uVar7 + 1;
      do {
        iVar11 = iVar11 + -1;
        if (iVar11 == 0) {
          uVar8 = 0x706;
          break;
        }
        sVar9 = Frame::capacity(&local_1e8);
        if (sVar9 < 4) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"AddRemoteRoute",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"(): frame too short to be AMS response \'0x",0x2a);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          Frame::capacity(&local_1e8);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'\n",2);
          std::__cxx11::stringbuf::str();
          Logger::Log(3,&local_208);
LAB_00119895:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_1c8);
          uVar8 = 0x705;
LAB_001198c8:
          bVar1 = false;
        }
        else {
          uVar5 = Frame::pop<unsigned_short>(&local_1e8);
          uVar6 = Frame::pop<unsigned_short>(&local_1e8);
          if (uVar5 == 1) {
            if (uVar6 != 4) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"AddRemoteRoute",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"(): response contains invalid tag length \'",0x2a);
              *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                   *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'\n",2);
              std::__cxx11::stringbuf::str();
              Logger::Log(3,&local_208);
              goto LAB_00119895;
            }
            uVar7 = Frame::pop<unsigned_int>(&local_1e8);
            uVar8 = (ulong)uVar7;
            goto LAB_001198c8;
          }
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"AddRemoteRoute",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"(): response contains tagId \'0x",0x1f);
          *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
               *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\' -> ignoring\n",0xe);
          std::__cxx11::stringbuf::str();
          Logger::Log(2,&local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_1c8);
          bVar1 = true;
          Frame::remove(&local_1e8,(char *)(ulong)uVar6);
        }
      } while (bVar1);
    }
  }
  if (local_1e8.m_Data._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
    operator_delete__((void *)local_1e8.m_Data._M_t.
                              super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                              .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  }
  return uVar8;
}

Assistant:

long AddRemoteRoute(const std::string& remote,
                    AmsNetId           destNetId,
                    const std::string& destAddr,
                    const std::string& routeName,
                    const std::string& remoteUsername,
                    const std::string& remotePassword)
{
    Frame f { 256 };
    uint32_t tagCount = 0;
    tagCount += PrependUdpTag(f, destAddr, UdpTag::COMPUTERNAME);
    tagCount += PrependUdpTag(f, remotePassword, UdpTag::PASSWORD);
    tagCount += PrependUdpTag(f, remoteUsername, UdpTag::USERNAME);
    tagCount += PrependUdpTag(f, destNetId, UdpTag::NETID);
    tagCount += PrependUdpTag(f, routeName.empty() ? destAddr : routeName, UdpTag::ROUTENAME);
    f.prepend(htole(tagCount));

    const auto myAddr = AmsAddr { destNetId, 0 };
    f.prepend(&myAddr, sizeof(myAddr));

    const auto status = SendRecv(remote, f, UdpServiceId::ADDROUTE);
    if (status) {
        return status;
    }

    // We expect at least the AmsAddr and count fields
    if (sizeof(AmsAddr) + sizeof(uint32_t) > f.capacity()) {
        LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() << "'\n");
        return ADSERR_DEVICE_INVALIDSIZE;
    }

    // ignore AmsAddr in response
    f.remove(sizeof(AmsAddr));

    // process UDP discovery tags
    auto count = f.pop_letoh<uint32_t>();
    while (count--) {
        uint16_t tag;
        uint16_t len;
        if (sizeof(tag) + sizeof(len) > f.capacity()) {
            LOG_ERROR(__FUNCTION__ << "(): frame too short to be AMS response '0x" << std::hex << f.capacity() <<
                      "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }

        tag = f.pop_letoh<uint16_t>();
        len = f.pop_letoh<uint16_t>();
        if (1 != tag) {
            LOG_WARN(__FUNCTION__ << "(): response contains tagId '0x" << std::hex << tag << "' -> ignoring\n");
            f.remove(len);
            continue;
        }
        if (sizeof(uint32_t) != len) {
            LOG_ERROR(__FUNCTION__ << "(): response contains invalid tag length '" << std::hex << len << "'\n");
            return ADSERR_DEVICE_INVALIDSIZE;
        }
        return f.pop_letoh<uint32_t>();
    }
    return ADSERR_DEVICE_INVALIDDATA;
}